

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cPar_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ZSTD_strategy ZVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (0x1d < cPar.hashLog) {
    cPar.hashLog = 0x1e;
  }
  uVar1 = 6;
  if (6 < cPar.hashLog) {
    uVar1 = cPar.hashLog;
  }
  uVar5 = 0x1e;
  if (cPar.searchLog < 0x1e) {
    uVar5 = cPar.searchLog;
  }
  uVar2 = 1;
  if (cPar.searchLog != 0) {
    uVar2 = uVar5;
  }
  uVar5 = 7;
  if (cPar.searchLength < 7) {
    uVar5 = cPar.searchLength;
  }
  uVar3 = 3;
  if (3 < uVar5) {
    uVar3 = uVar5;
  }
  ZVar4 = ZSTD_btultra;
  if (cPar.strategy < ZSTD_btultra) {
    ZVar4 = cPar.strategy;
  }
  uVar5 = -(uint)(-0x7fffffe2 < (int)(cPar.windowLog ^ 0x80000000));
  uVar7 = -(uint)(-0x7fffffe3 < (int)(cPar.chainLog ^ 0x80000000));
  uVar6 = uVar5 & 0x1f | ~uVar5 & cPar.windowLog;
  uVar8 = uVar7 & 0x1e | ~uVar7 & cPar.chainLog;
  uVar5 = -(uint)(-0x7ffffff6 < (int)(uVar6 ^ 0x80000000));
  uVar7 = -(uint)(-0x7ffffffa < (int)(uVar8 ^ 0x80000000));
  cPar_00.strategy = ZVar4;
  cPar_00.targetLength = cPar.targetLength + (cPar.targetLength == 0);
  cPar_00.chainLog = ~uVar7 & 6 | uVar8 & uVar7;
  cPar_00.windowLog = ~uVar5 & 10 | uVar6 & uVar5;
  cPar_00.hashLog = uVar1;
  cPar_00.searchLog = uVar2;
  cPar_00.searchLength = uVar3;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar_00,srcSize,dictSize);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_clampCParams(ZSTD_compressionParameters cParams)
{
#   define CLAMP(val,min,max) {      \
        if (val<min) val=min;        \
        else if (val>max) val=max;   \
    }
    CLAMP(cParams.windowLog, ZSTD_WINDOWLOG_MIN, ZSTD_WINDOWLOG_MAX);
    CLAMP(cParams.chainLog, ZSTD_CHAINLOG_MIN, ZSTD_CHAINLOG_MAX);
    CLAMP(cParams.hashLog, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
    CLAMP(cParams.searchLog, ZSTD_SEARCHLOG_MIN, ZSTD_SEARCHLOG_MAX);
    CLAMP(cParams.searchLength, ZSTD_SEARCHLENGTH_MIN, ZSTD_SEARCHLENGTH_MAX);
    if ((U32)(cParams.targetLength) < ZSTD_TARGETLENGTH_MIN) cParams.targetLength = ZSTD_TARGETLENGTH_MIN;
    if ((U32)(cParams.strategy) > (U32)ZSTD_btultra) cParams.strategy = ZSTD_btultra;
    return cParams;
}